

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O2

Texture2D * __thiscall
vkt::DynamicState::anon_unknown_4::ViewportParamTestInstane::buildReferenceFrame
          (Texture2D *__return_storage_ptr__,ViewportParamTestInstane *this)

{
  int y;
  int iVar1;
  int iVar2;
  int x;
  int x_00;
  float fVar3;
  double dVar4;
  float fVar5;
  Vec4 local_58;
  double local_40;
  double local_38;
  
  local_58.m_data._0_8_ =
       ::vk::mapVkFormat((this->super_ViewportStateBaseCase).super_DynamicStateBaseClass.
                         m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(__return_storage_ptr__,(TextureFormat *)&local_58,0x80,0x80);
  tcu::Texture2D::allocLevel(__return_storage_ptr__,0);
  iVar1 = __return_storage_ptr__->m_width;
  iVar2 = __return_storage_ptr__->m_height;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  tcu::clear((__return_storage_ptr__->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_58);
  local_40 = (double)iVar2 * 0.5;
  dVar4 = (double)iVar1 * 0.5;
  y = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  local_38 = dVar4;
  for (; y != iVar2; y = y + 1) {
    fVar5 = (float)((double)y / local_40) + -1.0;
    for (x_00 = 0; iVar1 != x_00; x_00 = x_00 + 1) {
      fVar3 = (float)((double)x_00 / dVar4) + -1.0;
      if ((((fVar5 <= 1.0) && (0.0 <= fVar5)) && (0.0 <= fVar3)) && (fVar3 <= 1.0)) {
        local_58.m_data[0] = 0.0;
        local_58.m_data[1] = 1.0;
        local_58.m_data[2] = 0.0;
        local_58.m_data[3] = 1.0;
        tcu::PixelBufferAccess::setPixel
                  ((__return_storage_ptr__->super_TextureLevelPyramid).m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_58,x_00,y,0);
        dVar4 = local_38;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::Texture2D buildReferenceFrame (void)
	{
		tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
		referenceFrame.allocLevel(0);

		const deInt32 frameWidth	= referenceFrame.getWidth();
		const deInt32 frameHeight	= referenceFrame.getHeight();

		tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		for (int y = 0; y < frameHeight; y++)
		{
			const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

			for (int x = 0; x < frameWidth; x++)
			{
				const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

				if (xCoord >= 0.0f && xCoord <= 1.0f && yCoord >= 0.0f && yCoord <= 1.0f)
					referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
			}
		}

		return referenceFrame;
	}